

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx512_functor::binary_op_sub>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  binary_op_sub *in_RDX;
  undefined8 *in_RSI;
  binary_op_sub *this;
  long *in_RDI;
  bool bVar3;
  float fVar4;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar5 [32];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  __m128 afVar14;
  __m128 _outp_2;
  __m128 _p_2;
  __m128 _b0;
  __m256 _outp_1;
  __m256 _p_1;
  __m256 _b0_avx;
  __m512 _outp;
  __m512 _p;
  __m512 _b0_avx512;
  int i;
  float *outptr;
  float b0;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  binary_op_sub op;
  Mat *m;
  Mat *m_1;
  __m256 *in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c8;
  Allocator *in_stack_fffffffffffff9d8;
  Mat *in_stack_fffffffffffff9e0;
  Mat *in_stack_fffffffffffff9e8;
  __m512 *x;
  binary_op_sub *this_00;
  float local_5c0 [2];
  float afStack_5b8 [2];
  float local_5b0 [2];
  float afStack_5a8 [2];
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  int local_464;
  float local_460 [8];
  long local_440;
  float local_438;
  float local_434;
  float local_430;
  float local_42c;
  float local_428;
  undefined8 local_420;
  binary_op_sub *local_418;
  float local_40c;
  undefined8 local_408;
  undefined8 local_400;
  undefined8 local_3f8;
  undefined4 local_3f0;
  long local_3e8;
  undefined4 local_3e0;
  undefined4 local_3dc;
  undefined4 local_3d8;
  undefined4 local_3d4;
  undefined4 local_3d0;
  undefined8 local_3c8;
  float *local_3c0;
  int local_3b8;
  int local_3b4;
  int local_3b0;
  int local_3ac;
  int local_3a8;
  int local_3a4;
  int local_3a0;
  binary_op_sub local_399 [9];
  binary_op_sub *local_390;
  undefined8 *local_388;
  long *local_380;
  int local_374;
  binary_op_sub *local_370;
  undefined1 local_365;
  int local_364;
  undefined8 *local_358;
  undefined8 *local_350;
  undefined8 *local_340;
  float *local_338;
  undefined1 local_32d;
  int local_32c;
  float *local_320;
  float *local_310;
  float *local_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  binary_op_sub *local_288;
  undefined1 local_280 [64];
  float local_22c;
  float *local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  binary_op_sub *local_200;
  float *local_1f8;
  undefined8 local_1f0;
  float afStack_1e8 [4];
  binary_op_sub *local_1d8;
  binary_op_sub *local_1d0;
  long local_1c8;
  undefined4 local_1bc;
  long local_1b8;
  binary_op_sub *local_1b0;
  undefined4 local_1a4;
  int local_1a0;
  int local_19c;
  __m512 *local_198;
  long local_190;
  undefined4 local_184;
  long local_180;
  float *local_178;
  undefined4 local_16c;
  int local_168;
  int local_164;
  undefined8 *local_160;
  undefined4 local_154;
  long local_150;
  undefined4 local_144;
  long local_140;
  float *local_120;
  undefined8 *local_110;
  undefined8 local_d8;
  float local_c4;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float local_a4;
  undefined1 local_a0 [32];
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  
  local_3a0 = *(int *)((long)in_RDI + 0x2c);
  local_3a4 = (int)in_RDI[6];
  local_3a8 = *(int *)((long)in_RDI + 0x34);
  local_3ac = (int)in_RDI[7];
  local_3b0 = (int)in_RDI[3];
  local_3b4 = local_3a0 * local_3a4 * local_3a8 * local_3b0;
  local_390 = in_RDX;
  local_388 = in_RSI;
  local_380 = in_RDI;
  Mat::create_like(in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
  local_370 = local_390;
  bVar3 = true;
  if (*(long *)local_390 != 0) {
    local_1d0 = local_390;
    bVar3 = *(long *)(local_390 + 0x40) * (long)*(int *)(local_390 + 0x38) == 0;
  }
  if (bVar3) {
    local_374 = -100;
  }
  else {
    for (local_3b8 = 0; local_3b8 < local_3ac; local_3b8 = local_3b8 + 1) {
      local_358 = &local_408;
      local_164 = *(int *)((long)local_380 + 0x2c);
      local_168 = (int)local_380[6];
      local_16c = *(undefined4 *)((long)local_380 + 0x34);
      local_3c0 = (float *)(*local_380 + local_380[8] * (long)local_3b8 * local_380[2]);
      local_180 = local_380[2];
      local_184 = (undefined4)local_380[3];
      local_190 = local_380[4];
      local_160 = &local_408;
      local_150 = (long)local_164 * (long)local_168 * local_180;
      local_350 = &local_408;
      local_340 = &local_408;
      local_40c = *(float *)*local_388;
      local_320 = local_460;
      local_19c = *(int *)(local_390 + 0x2c);
      local_1a0 = *(int *)(local_390 + 0x30);
      local_1a4 = *(undefined4 *)(local_390 + 0x34);
      this = (binary_op_sub *)
             (*(long *)local_390 +
             *(long *)(local_390 + 0x40) * (long)local_3b8 * *(long *)(local_390 + 0x10));
      local_1b8 = *(long *)(local_390 + 0x10);
      local_1bc = *(undefined4 *)(local_390 + 0x18);
      local_1c8 = *(long *)(local_390 + 0x20);
      x = (__m512 *)local_460;
      local_140 = (long)local_19c * (long)local_1a0 * local_1b8;
      local_310 = local_460;
      local_338 = local_460;
      local_3d0 = 0;
      local_3d4 = 0;
      local_3d8 = 0;
      local_3dc = 0;
      local_3f0 = 0;
      local_3f8 = 0;
      local_400 = 0;
      local_408 = 0;
      local_d8 = 0;
      local_144 = 0x10;
      local_154 = 0x10;
      local_32c = local_3b8;
      local_32d = 1;
      local_364 = local_3b8;
      local_365 = 1;
      local_3c8 = 0;
      local_3e0 = 0;
      local_460[0] = 0.0;
      local_460[1] = 0.0;
      local_460[4] = 0.0;
      local_460[5] = 0.0;
      local_460[6] = 0.0;
      local_438 = 0.0;
      local_434 = 0.0;
      local_430 = 0.0;
      local_42c = 0.0;
      local_428 = 0.0;
      local_420 = 0;
      local_460[2] = 0.0;
      local_460[3] = 0.0;
      local_464 = 0;
      local_280 = vbroadcastss_avx512f(ZEXT416((uint)local_40c));
      local_4c0 = local_280._0_8_;
      uStack_4b8 = local_280._8_8_;
      uStack_4b0 = local_280._16_8_;
      uStack_4a8 = local_280._24_8_;
      uStack_4a0 = local_280._32_8_;
      uStack_498 = local_280._40_8_;
      uStack_490 = local_280._48_8_;
      uStack_488 = local_280._56_8_;
      this_00 = local_390;
      local_418 = this;
      local_22c = local_40c;
      local_1b0 = this;
      local_198 = x;
      local_178 = local_3c0;
      local_120 = local_338;
      local_110 = local_340;
      local_440 = local_1c8;
      local_3e8 = local_190;
      for (; local_464 + 0xf < local_3b4; local_464 = local_464 + 0x10) {
        local_308 = local_3c0;
        uVar7 = *(undefined8 *)local_3c0;
        uVar6 = *(undefined8 *)(local_3c0 + 2);
        uVar8 = *(undefined8 *)(local_3c0 + 4);
        uVar9 = *(undefined8 *)(local_3c0 + 6);
        uVar10 = *(undefined8 *)(local_3c0 + 8);
        uVar11 = *(undefined8 *)(local_3c0 + 10);
        uVar12 = *(undefined8 *)(local_3c0 + 0xc);
        uVar13 = *(undefined8 *)(local_3c0 + 0xe);
        local_500 = uVar7;
        uStack_4f8 = uVar6;
        uStack_4f0 = uVar8;
        uStack_4e8 = uVar9;
        uStack_4e0 = uVar10;
        uStack_4d8 = uVar11;
        uStack_4d0 = uVar12;
        uStack_4c8 = uVar13;
        BinaryOp_x86_avx512_functor::binary_op_sub::func_pack16
                  (this_00,x,(__m512 *)in_stack_fffffffffffff9e0);
        local_288 = local_418;
        *(undefined8 *)local_418 = uVar7;
        *(undefined8 *)(local_418 + 8) = uVar6;
        *(undefined8 *)(local_418 + 0x10) = uVar8;
        *(undefined8 *)(local_418 + 0x18) = uVar9;
        *(undefined8 *)(local_418 + 0x20) = uVar10;
        *(undefined8 *)(local_418 + 0x28) = uVar11;
        *(undefined8 *)(local_418 + 0x30) = uVar12;
        *(undefined8 *)(local_418 + 0x38) = uVar13;
        local_3c0 = local_3c0 + 0x10;
        local_418 = local_418 + 0x40;
        local_540 = uVar7;
        uStack_538 = uVar6;
        uStack_530 = uVar8;
        uStack_528 = uVar9;
        uStack_520 = uVar10;
        uStack_518 = uVar11;
        uStack_510 = uVar12;
        uStack_508 = uVar13;
        local_300 = uVar7;
        uStack_2f8 = uVar6;
        uStack_2f0 = uVar8;
        uStack_2e8 = uVar9;
        uStack_2e0 = uVar10;
        uStack_2d8 = uVar11;
        uStack_2d0 = uVar12;
        uStack_2c8 = uVar13;
      }
      local_c4 = local_40c;
      local_54 = local_40c;
      local_58 = local_40c;
      local_5c = local_40c;
      local_60 = local_40c;
      local_64 = local_40c;
      local_68 = local_40c;
      local_6c = local_40c;
      local_70 = local_40c;
      auVar1 = vinsertps_avx(ZEXT416((uint)local_40c),ZEXT416((uint)local_40c),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_40c),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_40c),0x30);
      auVar2 = vinsertps_avx(ZEXT416((uint)local_40c),ZEXT416((uint)local_40c),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_40c),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_40c),0x30);
      auVar5._16_16_ = auVar1;
      auVar5._0_16_ = auVar2;
      local_a0._0_8_ = auVar2._0_8_;
      local_a0._8_8_ = auVar2._8_8_;
      local_a0._16_8_ = auVar1._0_8_;
      local_a0._24_8_ = auVar1._8_8_;
      local_560 = local_a0._0_8_;
      uStack_558 = local_a0._8_8_;
      uStack_550 = local_a0._16_8_;
      uStack_548 = local_a0._24_8_;
      fVar4 = local_40c;
      local_a0 = auVar5;
      for (; local_464 + 7 < local_3b4; local_464 = local_464 + 8) {
        local_228 = local_3c0;
        uVar7 = *(undefined8 *)local_3c0;
        uVar6 = *(undefined8 *)(local_3c0 + 2);
        uVar8 = *(undefined8 *)(local_3c0 + 4);
        uVar9 = *(undefined8 *)(local_3c0 + 6);
        local_580 = uVar7;
        uStack_578 = uVar6;
        uStack_570 = uVar8;
        uStack_568 = uVar9;
        BinaryOp_x86_avx512_functor::binary_op_sub::func_pack8
                  (this,(__m256 *)CONCAT44(fVar4,in_stack_fffffffffffff9c8),
                   in_stack_fffffffffffff9c0);
        local_200 = local_418;
        *(undefined8 *)local_418 = uVar7;
        *(undefined8 *)(local_418 + 8) = uVar6;
        *(undefined8 *)(local_418 + 0x10) = uVar8;
        *(undefined8 *)(local_418 + 0x18) = uVar9;
        local_3c0 = local_3c0 + 8;
        local_418 = local_418 + 0x20;
        local_5a0 = uVar7;
        uStack_598 = uVar6;
        uStack_590 = uVar8;
        uStack_588 = uVar9;
        local_220 = uVar7;
        uStack_218 = uVar6;
        uStack_210 = uVar8;
        uStack_208 = uVar9;
      }
      local_a4 = local_40c;
      local_c0 = local_40c;
      fStack_bc = local_40c;
      fStack_b8 = local_40c;
      fStack_b4 = local_40c;
      local_5b0[1] = local_40c;
      local_5b0[0] = local_40c;
      afStack_5a8[1] = local_40c;
      afStack_5a8[0] = local_40c;
      for (; local_464 + 3 < local_3b4; local_464 = local_464 + 4) {
        local_1f8 = local_3c0;
        local_5c0 = *(float (*) [2])local_3c0;
        uVar7 = *(undefined8 *)(local_3c0 + 2);
        afStack_5b8 = (float  [2])uVar7;
        afVar14 = BinaryOp_x86_avx512_functor::binary_op_sub::func_pack4
                            (local_399,(__m128 *)local_5c0,(__m128 *)local_5b0);
        local_1f0 = afVar14._0_8_;
        local_1d8 = local_418;
        *(undefined8 *)local_418 = local_1f0;
        *(undefined8 *)(local_418 + 8) = uVar7;
        local_3c0 = local_3c0 + 4;
        local_418 = local_418 + 0x10;
        afStack_1e8._0_8_ = uVar7;
      }
      for (; local_464 < local_3b4; local_464 = local_464 + 1) {
        fVar4 = BinaryOp_x86_avx512_functor::binary_op_sub::func(local_399,local_3c0,&local_40c);
        *(float *)local_418 = fVar4;
        local_3c0 = local_3c0 + 1;
        local_418 = local_418 + 4;
      }
    }
    local_374 = 0;
  }
  return local_374;
}

Assistant:

static int binary_op_6_11_16_25(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 6 11 16 25
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float b0 = b[0];
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b0_avx512 = _mm512_set1_ps(b0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_p, _b0_avx512);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b0_avx = _mm256_set1_ps(b0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_p, _b0_avx);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b0 = _mm_set1_ps(b0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_p, _b0);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b0);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}